

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

bool __thiscall CallStatement::callFinder(CallStatement *this,Token *id)

{
  __type _Var1;
  ulong uVar2;
  long lVar3;
  _Vector_base<Function_*,_std::allocator<Function_*>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  do {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)&local_70,
               &(this->super_Functions)._functionStack);
    lVar3 = local_70._M_string_length - (long)local_70._M_dataplus._M_p;
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
              ((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&local_70);
    if ((ulong)(lVar3 >> 3) <= uVar2) {
      return true;
    }
    std::__cxx11::string::string((string *)&local_70,(string *)id);
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)&local_88,
               &(this->super_Functions)._functionStack);
    (*(local_88._M_impl.super__Vector_impl_data._M_start[uVar2]->super_Statement)._vptr_Statement[3]
    )(&local_50);
    _Var1 = std::operator==(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(&local_88);
    std::__cxx11::string::~string((string *)&local_70);
    uVar2 = uVar2 + 1;
  } while (!_Var1);
  return true;
}

Assistant:

bool CallStatement::callFinder(const Token& id){
    for(int i = 0; i < getFunctionStack().size();i++) {
        if (id.getName() == getFunctionStack()[i]->id())
            return true;
    }
}